

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

Status __thiscall
soplex::SPxSolverBase<double>::varStatusToBasisStatusCol
          (SPxSolverBase<double> *this,int col,VarStatus stat)

{
  Status SVar1;
  ostream *poVar2;
  SPxInternalCodeException *this_00;
  allocator local_39;
  string local_38;
  
  switch(stat) {
  case ON_UPPER:
    SVar1 = P_ON_UPPER;
    break;
  case ON_LOWER:
    SVar1 = P_ON_LOWER;
    break;
  case FIXED:
    SVar1 = P_FIXED;
    break;
  case ZERO:
    SVar1 = P_FREE;
    break;
  case BASIC:
    SVar1 = SPxBasisBase<double>::dualColStatus(&this->super_SPxBasisBase<double>,col);
    return SVar1;
  default:
    poVar2 = std::operator<<((ostream *)&std::cerr,"ESOLVE28 ERROR: unknown VarStatus (");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,stat);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_38,"XSOLVE24 This should never happen.",&local_39)
    ;
    SPxInternalCodeException::SPxInternalCodeException(this_00,&local_38);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  return SVar1;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
   SPxSolverBase<R>::varStatusToBasisStatusCol(int col,
         typename SPxSolverBase<R>::VarStatus stat) const
   {
      typename SPxBasisBase<R>::Desc::Status cstat;

      switch(stat)
      {
      case FIXED :
         cstat = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case ON_LOWER :
         cstat = SPxBasisBase<R>::Desc::P_ON_LOWER;
         break;

      case ON_UPPER :
         cstat = SPxBasisBase<R>::Desc::P_ON_UPPER;
         break;

      case ZERO :
         cstat = SPxBasisBase<R>::Desc::P_FREE;
         break;

      case BASIC :
         cstat = this->dualColStatus(col);
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ESOLVE28 ERROR: unknown VarStatus (" << int(stat) << ")"
                       << std::endl;)
         throw SPxInternalCodeException("XSOLVE24 This should never happen.");
      }

      return cstat;
   }